

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  char *end;
  undefined1 local_868 [8];
  stream_line_reader line_reader;
  char buf [2048];
  int bufsiz;
  Headers *headers_local;
  Stream *strm_local;
  
  __stream = (FILE *)0x800;
  stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_868,strm,
             line_reader.glowable_buffer_.field_2._M_local_buf + 8,0x800);
  __n = extraout_RDX;
  do {
    do {
      uVar2 = stream_line_reader::getline
                        ((stream_line_reader *)local_868,(char **)strm,__n,__stream);
      if ((uVar2 & 1) == 0) {
        strm_local._7_1_ = false;
LAB_00124065:
        stream_line_reader::~stream_line_reader((stream_line_reader *)local_868);
        return strm_local._7_1_;
      }
      bVar1 = stream_line_reader::end_with_crlf((stream_line_reader *)local_868);
      __n = extraout_RDX_00;
    } while (!bVar1);
    sVar3 = stream_line_reader::size((stream_line_reader *)local_868);
    if (sVar3 == 2) {
      strm_local._7_1_ = true;
      goto LAB_00124065;
    }
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_868);
    __stream = (FILE *)stream_line_reader::size((stream_line_reader *)local_868);
    strm = (Stream *)(pcVar4 + -2 + (long)__stream);
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_868);
    parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
              (pcVar4,(char *)strm,(anon_class_8_1_b2c1a266)headers);
    __n = extraout_RDX_01;
  } while( true );
}

Assistant:

inline bool read_headers(Stream &strm, Headers &headers) {
			const auto bufsiz = 2048;
			char buf[bufsiz];
			stream_line_reader line_reader(strm, buf, bufsiz);

			for (;;) {
				if (!line_reader.getline()) { return false; }

				// Check if the line ends with CRLF.
				if (line_reader.end_with_crlf()) {
					// Blank line indicates end of headers.
					if (line_reader.size() == 2) { break; }
				} else {
					continue; // Skip invalid line.
				}

				// Exclude CRLF
				auto end = line_reader.ptr() + line_reader.size() - 2;

				parse_header(line_reader.ptr(), end,
							 [&](std::string &&key, std::string &&val) {
								 headers.emplace(std::move(key), std::move(val));
							 });
			}

			return true;
		}